

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_pathfind(command *cmd)

{
  player_upkeep *ppVar1;
  wchar_t wVar2;
  loc_conflict local_18;
  loc_conflict grid;
  command *cmd_local;
  
  grid = (loc_conflict)cmd;
  cmd_get_arg_point(cmd,"point",&local_18);
  if (player->timed[4] == 0) {
    if (player->upkeep->steps != (int16_t *)0x0) {
      __assert_fail("!player->upkeep->steps",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                    ,0x63b,"void do_cmd_pathfind(struct command *)");
    }
    wVar2 = find_path(player,player->grid,(loc)local_18,&player->upkeep->steps);
    player->upkeep->step_count = wVar2;
    if (L'\0' < player->upkeep->step_count) {
      ppVar1 = player->upkeep;
      (ppVar1->path_dest).x = local_18.x;
      (ppVar1->path_dest).y = local_18.y;
      player->upkeep->running = player->upkeep->step_count;
      player->upkeep->update = player->upkeep->update | 2;
      run_step(L'\0');
    }
  }
  return;
}

Assistant:

void do_cmd_pathfind(struct command *cmd)
{
	struct loc grid;

	/* XXX-AS Add better arg checking */
	cmd_get_arg_point(cmd, "point", &grid);

	if (player->timed[TMD_CONFUSED])
		return;

	assert(!player->upkeep->steps);
	player->upkeep->step_count =
		find_path(player, player->grid, grid, &player->upkeep->steps);
	if (player->upkeep->step_count > 0) {
		player->upkeep->path_dest = grid;
		player->upkeep->running = player->upkeep->step_count;
		/* Calculate torch radius */
		player->upkeep->update |= (PU_TORCH);
		run_step(0);
	}
}